

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

aom_variance_fn_t highbd_get_block_variance_fn(BLOCK_SIZE bsize,int bd)

{
  int bd_local;
  BLOCK_SIZE bsize_local;
  _func_uint_uint8_t_ptr_int_uint8_t_ptr_int_uint_ptr *local_8;
  
  if (bd == 10) {
    if (bsize == BLOCK_8X8) {
      local_8 = aom_highbd_10_mse8x8_sse2;
    }
    else if (bsize == BLOCK_8X16) {
      local_8 = aom_highbd_10_mse8x16_c;
    }
    else if (bsize == BLOCK_16X8) {
      local_8 = aom_highbd_10_mse16x8_c;
    }
    else {
      local_8 = aom_highbd_10_mse16x16;
    }
  }
  else if (bd == 0xc) {
    if (bsize == BLOCK_8X8) {
      local_8 = aom_highbd_12_mse8x8_sse2;
    }
    else if (bsize == BLOCK_8X16) {
      local_8 = aom_highbd_12_mse8x16_c;
    }
    else if (bsize == BLOCK_16X8) {
      local_8 = aom_highbd_12_mse16x8_c;
    }
    else {
      local_8 = aom_highbd_12_mse16x16_sse2;
    }
  }
  else if (bsize == BLOCK_8X8) {
    local_8 = aom_highbd_8_mse8x8_sse2;
  }
  else if (bsize == BLOCK_8X16) {
    local_8 = aom_highbd_8_mse8x16_c;
  }
  else if (bsize == BLOCK_16X8) {
    local_8 = aom_highbd_8_mse16x8_c;
  }
  else {
    local_8 = aom_highbd_8_mse16x16_sse2;
  }
  return local_8;
}

Assistant:

static aom_variance_fn_t highbd_get_block_variance_fn(BLOCK_SIZE bsize,
                                                      int bd) {
  switch (bd) {
    default:
      switch (bsize) {
        case BLOCK_8X8: return aom_highbd_8_mse8x8;
        case BLOCK_16X8: return aom_highbd_8_mse16x8;
        case BLOCK_8X16: return aom_highbd_8_mse8x16;
        default: return aom_highbd_8_mse16x16;
      }
    case 10:
      switch (bsize) {
        case BLOCK_8X8: return aom_highbd_10_mse8x8;
        case BLOCK_16X8: return aom_highbd_10_mse16x8;
        case BLOCK_8X16: return aom_highbd_10_mse8x16;
        default: return aom_highbd_10_mse16x16;
      }
    case 12:
      switch (bsize) {
        case BLOCK_8X8: return aom_highbd_12_mse8x8;
        case BLOCK_16X8: return aom_highbd_12_mse16x8;
        case BLOCK_8X16: return aom_highbd_12_mse8x16;
        default: return aom_highbd_12_mse16x16;
      }
  }
}